

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O2

void __thiscall amrex::MLMG::makeSolvable(MLMG *this)

{
  ostream *os_;
  Print *pPVar1;
  ulong uVar2;
  ulong uVar3;
  ostringstream *this_00;
  long lVar4;
  ulong uVar5;
  int alev;
  _Vector_base<double,_std::allocator<double>_> local_1d0;
  Print local_1b8;
  
  uVar5 = 0;
  (*this->linop->_vptr_MLLinOp[0x1b])
            (&local_1d0,this->linop,0,0,
             (this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (3 < this->verbose) {
    uVar2 = (ulong)((long)local_1d0._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1d0._M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar3 = uVar2 & 0xffffffff;
    if ((int)uVar2 < 1) {
      uVar3 = uVar5;
    }
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      os_ = OutStream();
      Print::Print(&local_1b8,os_);
      std::operator<<((ostream *)&local_1b8.ss,"MLMG: Subtracting ");
      pPVar1 = Print::operator<<(&local_1b8,
                                 (double *)
                                 ((long)local_1d0._M_impl.super__Vector_impl_data._M_start + uVar5))
      ;
      this_00 = &pPVar1->ss;
      std::operator<<((ostream *)this_00," from rhs component ");
      std::ostream::operator<<(this_00,(int)uVar2);
      std::operator<<((ostream *)this_00,"\n");
      Print::~Print(&local_1b8);
      uVar5 = uVar5 + 8;
    }
  }
  lVar4 = 0;
  for (uVar5 = 0; (long)uVar5 < (long)this->namrlevs; uVar5 = uVar5 + 1) {
    (*this->linop->_vptr_MLLinOp[0x1c])
              (this->linop,uVar5 & 0xffffffff,0,
               (long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                        super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                        super__Vector_impl_data._M_start)->m_ptr)._M_t.
                      super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                      .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl + lVar4
               ,&local_1d0);
    lVar4 = lVar4 + 8;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1d0);
  return;
}

Assistant:

void
MLMG::makeSolvable ()
{
    auto const& offset = linop.getSolvabilityOffset(0, 0, rhs[0]);
    if (verbose >= 4) {
        const int ncomp = offset.size();
        for (int c = 0; c < ncomp; ++c) {
            amrex::Print() << "MLMG: Subtracting " << offset[c] << " from rhs component "
                           << c << "\n";
        }
    }
    for (int alev = 0; alev < namrlevs; ++alev) {
        linop.fixSolvabilityByOffset(alev, 0, rhs[alev], offset);
    }
}